

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Samplers::FunctionalTest::FunctionalTest
          (FunctionalTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"samplers_functional","Samplers Functional Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02137568;
  this->m_fbo = 0;
  this->m_rbo = 0;
  this->m_vao = 0;
  this->m_to = 0;
  this->m_so = 0;
  this->m_po = 0;
  return;
}

Assistant:

FunctionalTest::FunctionalTest(deqp::Context& context)
	: deqp::TestCase(context, "samplers_functional", "Samplers Functional Test")
	, m_fbo(0)
	, m_rbo(0)
	, m_vao(0)
	, m_to(0)
	, m_so(0)
	, m_po(0)
{
	/* Intentionally left blank. */
}